

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O3

LightLiSample * __thiscall
pbrt::PortalImageInfiniteLight::SampleLi
          (LightLiSample *__return_storage_ptr__,PortalImageInfiniteLight *this,
          LightSampleContext ctx,Point2f u,SampledWavelengths lambda,LightSamplingMode mode)

{
  undefined8 uVar1;
  Interval<float> IVar2;
  float fVar3;
  float fVar4;
  undefined1 auVar5 [16];
  float fVar6;
  Point3fi *pPVar7;
  Point3fi *pPVar8;
  uintptr_t iptr;
  undefined1 auVar9 [16];
  undefined1 in_register_00001208 [56];
  undefined1 auVar10 [64];
  undefined1 auVar15 [56];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar18 [56];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [32];
  Bounds2f BVar23;
  SampledSpectrum SVar24;
  Vector3f VVar25;
  float local_7c;
  Tuple3<pbrt::Point3,_float> local_78;
  float local_6c;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  Tuple2<pbrt::Point2,_float> local_40;
  Bounds2f local_38;
  undefined1 extraout_var [56];
  
  auVar10._8_56_ = in_register_00001208;
  auVar10._0_8_ = u.super_Tuple2<pbrt::Point2,_float>;
  local_40 = (Tuple2<pbrt::Point2,_float>)vmovlps_avx(auVar10._0_16_);
  auVar5 = vinsertps_avx(ctx.pi.super_Point3<pbrt::Interval<float>_>.
                         super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>._0_16_,
                         ZEXT416((uint)ctx.pi.super_Point3<pbrt::Interval<float>_>.
                                       super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.high),
                         0x10);
  auVar9._0_4_ = ctx.pi.super_Point3<pbrt::Interval<float>_>.
                 super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high + auVar5._0_4_;
  auVar9._4_4_ = ctx.pi.super_Point3<pbrt::Interval<float>_>.
                 super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low + auVar5._4_4_;
  auVar9._8_4_ = auVar5._8_4_ + 0.0;
  auVar9._12_4_ = auVar5._12_4_ + 0.0;
  auVar5._8_4_ = 0x3f000000;
  auVar5._0_8_ = 0x3f0000003f000000;
  auVar5._12_4_ = 0x3f000000;
  local_58 = vmulps_avx512vl(auVar9,auVar5);
  auVar18 = ZEXT856(local_58._8_8_);
  fVar6 = (ctx.pi.super_Point3<pbrt::Interval<float>_>.
           super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.low +
          ctx.pi.super_Point3<pbrt::Interval<float>_>.
          super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.high) * 0.5;
  auVar15 = (undefined1  [56])0x0;
  local_78._0_8_ = vmovlps_avx(local_58);
  local_78.z = fVar6;
  BVar23 = ImageBounds(this,(Point3f *)&local_78);
  auVar16._0_8_ = BVar23.pMax.super_Tuple2<pbrt::Point2,_float>;
  auVar16._8_56_ = auVar18;
  auVar11._0_8_ = BVar23.pMin.super_Tuple2<pbrt::Point2,_float>;
  auVar11._8_56_ = auVar15;
  local_38 = (Bounds2f)vmovlhps_avx(auVar11._0_16_,auVar16._0_16_);
  auVar12._0_8_ =
       WindowedPiecewiseConstant2D::Sample
                 (&this->distribution,(Point2f *)&local_40,&local_38,&local_7c);
  auVar12._8_56_ = extraout_var;
  auVar15 = ZEXT856(0);
  local_78._0_8_ = vmovlps_avx(auVar12._0_16_);
  if ((local_7c != 0.0) || (NAN(local_7c))) {
    auVar18 = extraout_var;
    VVar25 = RenderFromImage(this,(Point2f *)&local_78,&local_6c);
    auVar13._0_8_ = VVar25.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar13._8_56_ = auVar18;
    if ((local_6c != 0.0) || (NAN(local_6c))) {
      local_68 = auVar13._0_16_;
      auVar18 = ZEXT856(0);
      if (ABS(local_7c / local_6c) != INFINITY) {
        SVar24 = ImageLookup(this,(Point2f *)&local_78,&lambda);
        auVar17._0_8_ = SVar24.values.values._8_8_;
        auVar17._8_56_ = auVar15;
        auVar14._0_8_ = SVar24.values.values._0_8_;
        auVar14._8_56_ = auVar18;
        auVar5 = vmovlhps_avx(auVar14._0_16_,auVar17._0_16_);
        fVar3 = this->sceneRadius + this->sceneRadius;
        auVar9 = vmovshdup_avx(local_68);
        fVar6 = VVar25.super_Tuple3<pbrt::Vector3,_float>.z * fVar3 + fVar6;
        fVar4 = local_58._0_4_ + local_68._0_4_ * fVar3;
        auVar19 = vmovshdup_avx(local_58);
        fVar3 = auVar19._0_4_ + auVar9._0_4_ * fVar3;
        auVar20._4_4_ = fVar4;
        auVar20._0_4_ = fVar4;
        auVar20._8_4_ = fVar4;
        auVar20._12_4_ = fVar4;
        auVar21._4_4_ = fVar3;
        auVar21._0_4_ = fVar3;
        auVar21._8_4_ = fVar3;
        auVar21._12_4_ = fVar3;
        auVar9 = vmovlhps_avx(auVar20,auVar21);
        auVar19._4_4_ = fVar6;
        auVar19._0_4_ = fVar6;
        auVar19._8_4_ = fVar6;
        auVar19._12_4_ = fVar6;
        auVar22 = ZEXT432(0) << 0x20;
        (__return_storage_ptr__->pLight).wo = (Vector3f)auVar22._0_12_;
        (__return_storage_ptr__->pLight).n = (Normal3f)auVar22._12_12_;
        (__return_storage_ptr__->pLight).uv = (Point2f)auVar22._24_8_;
        *(undefined1 (*) [16])(__return_storage_ptr__->L).values.values = auVar5;
        uVar1 = vmovlps_avx(local_68);
        (__return_storage_ptr__->wi).super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar1;
        (__return_storage_ptr__->wi).super_Tuple3<pbrt::Vector3,_float>.y =
             (float)(int)((ulong)uVar1 >> 0x20);
        (__return_storage_ptr__->wi).super_Tuple3<pbrt::Vector3,_float>.z =
             VVar25.super_Tuple3<pbrt::Vector3,_float>.z;
        __return_storage_ptr__->pdf = local_7c / local_6c;
        (__return_storage_ptr__->light).
        super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
        .bits = (ulong)this | 0x9000000000000;
        pPVar7 = &(__return_storage_ptr__->pLight).pi;
        pPVar8 = &(__return_storage_ptr__->pLight).pi;
        (pPVar7->super_Point3<pbrt::Interval<float>_>).
        super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low = (float)(int)auVar9._0_8_;
        (pPVar7->super_Point3<pbrt::Interval<float>_>).
        super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high =
             (float)(int)((ulong)auVar9._0_8_ >> 0x20);
        (pPVar8->super_Point3<pbrt::Interval<float>_>).
        super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low = (float)(int)auVar9._8_8_;
        (pPVar8->super_Point3<pbrt::Interval<float>_>).
        super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.high =
             (float)(int)((ulong)auVar9._8_8_ >> 0x20);
        IVar2 = (Interval<float>)vmovlps_avx(auVar19);
        (__return_storage_ptr__->pLight).pi.super_Point3<pbrt::Interval<float>_>.
        super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z = IVar2;
        (__return_storage_ptr__->pLight).time = 0.0;
        (__return_storage_ptr__->pLight).mediumInterface = &(this->super_LightBase).mediumInterface;
        (__return_storage_ptr__->pLight).medium.
        super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
        .bits = 0;
        return __return_storage_ptr__;
      }
      LogFatal<char_const(&)[12]>
                (Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/lights.cpp"
                 ,0x443,"Check failed: %s",(char (*) [12])"!IsInf(pdf)");
    }
  }
  pPVar7 = &(__return_storage_ptr__->pLight).pi;
  (pPVar7->super_Point3<pbrt::Interval<float>_>).super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.
  z.low = 0.0;
  (pPVar7->super_Point3<pbrt::Interval<float>_>).super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.
  z.high = 0.0;
  (__return_storage_ptr__->pLight).time = 0.0;
  (__return_storage_ptr__->pLight).wo.super_Tuple3<pbrt::Vector3,_float>.x = 0.0;
  (__return_storage_ptr__->pLight).wo.super_Tuple3<pbrt::Vector3,_float>.y = 0.0;
  (__return_storage_ptr__->pLight).wo.super_Tuple3<pbrt::Vector3,_float>.z = 0.0;
  (__return_storage_ptr__->pLight).n.super_Tuple3<pbrt::Normal3,_float>.x = 0.0;
  (__return_storage_ptr__->pLight).n.super_Tuple3<pbrt::Normal3,_float>.y = 0.0;
  *(undefined8 *)&(__return_storage_ptr__->pLight).n.super_Tuple3<pbrt::Normal3,_float>.z = 0;
  *(undefined8 *)&(__return_storage_ptr__->pLight).uv.super_Tuple2<pbrt::Point2,_float>.y = 0;
  (__return_storage_ptr__->pLight).mediumInterface = (MediumInterface *)0x0;
  (__return_storage_ptr__->pLight).medium.
  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
  .bits = 0;
  (__return_storage_ptr__->L).values.values[0] = 0.0;
  (__return_storage_ptr__->L).values.values[1] = 0.0;
  (__return_storage_ptr__->L).values.values[2] = 0.0;
  (__return_storage_ptr__->L).values.values[3] = 0.0;
  (__return_storage_ptr__->wi).super_Tuple3<pbrt::Vector3,_float>.x = 0.0;
  (__return_storage_ptr__->wi).super_Tuple3<pbrt::Vector3,_float>.y = 0.0;
  *(undefined8 *)&(__return_storage_ptr__->wi).super_Tuple3<pbrt::Vector3,_float>.z = 0;
  (__return_storage_ptr__->light).
  super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
  .bits = 0;
  pPVar7 = &(__return_storage_ptr__->pLight).pi;
  (pPVar7->super_Point3<pbrt::Interval<float>_>).super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.
  x.low = 0.0;
  (pPVar7->super_Point3<pbrt::Interval<float>_>).super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.
  x.high = 0.0;
  pPVar7 = &(__return_storage_ptr__->pLight).pi;
  (pPVar7->super_Point3<pbrt::Interval<float>_>).super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.
  y.low = 0.0;
  (pPVar7->super_Point3<pbrt::Interval<float>_>).super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.
  y.high = 0.0;
  pPVar7 = &(__return_storage_ptr__->pLight).pi;
  (pPVar7->super_Point3<pbrt::Interval<float>_>).super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.
  z.low = 0.0;
  (pPVar7->super_Point3<pbrt::Interval<float>_>).super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.
  z.high = 0.0;
  return __return_storage_ptr__;
}

Assistant:

LightLiSample PortalImageInfiniteLight::SampleLi(LightSampleContext ctx, Point2f u,
                                                 SampledWavelengths lambda,
                                                 LightSamplingMode mode) const {
    Bounds2f b = ImageBounds(ctx.p());

    // Find $(u,v)$ sample coordinates in infinite light texture
    Float mapPDF;
    Point2f uv = distribution.Sample(u, b, &mapPDF);
    if (mapPDF == 0)
        return {};

    // Convert infinite light sample point to direction
    // Note: ignore WorldToLight since we already folded it in when we
    // resampled...
    Float duv_dw;
    Vector3f wi = RenderFromImage(uv, &duv_dw);
    if (duv_dw == 0)
        return {};

    // Compute PDF for sampled infinite light direction
    Float pdf = mapPDF / duv_dw;
    CHECK(!IsInf(pdf));

    SampledSpectrum L = ImageLookup(uv, lambda);

    return LightLiSample(
        this, L, wi, pdf,
        Interaction(ctx.p() + wi * (2 * sceneRadius), 0 /* time */, &mediumInterface));
}